

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress1X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  undefined1 *puVar1;
  byte bVar2;
  undefined2 uVar3;
  char cVar4;
  size_t sVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  BIT_DStream_t local_60;
  
  if ((flags & 1U) != 0) {
    sVar5 = HUF_decompress1X1_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar5;
  }
  uVar3 = *(undefined2 *)((long)DTable + 2);
  sVar5 = BIT_initDStream(&local_60,cSrc,cSrcSize);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  puVar1 = (undefined1 *)((long)dst + dstSize);
  cVar4 = (char)uVar3;
  if ((long)dstSize < 4) {
    if (local_60.bitsConsumed < 0x41) {
      if (local_60.ptr < local_60.limitPtr) {
        if (local_60.ptr == local_60.start) goto LAB_0016b58b;
        uVar8 = (int)local_60.ptr - (int)local_60.start;
        if (local_60.start <= (size_t *)((long)local_60.ptr - (ulong)(local_60.bitsConsumed >> 3)))
        {
          uVar8 = local_60.bitsConsumed >> 3;
        }
        local_60.bitsConsumed = local_60.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_60.bitsConsumed >> 3;
        local_60.bitsConsumed = local_60.bitsConsumed & 7;
      }
      local_60.ptr = (char *)((long)local_60.ptr - (ulong)uVar8);
      local_60.bitContainer = *(size_t *)local_60.ptr;
    }
  }
  else {
    bVar6 = -cVar4 & 0x3f;
    while (local_60.bitsConsumed < 0x41) {
      if (local_60.ptr < local_60.limitPtr) {
        if (local_60.ptr == local_60.start) break;
        bVar11 = local_60.start <=
                 (size_t *)((long)local_60.ptr - (ulong)(local_60.bitsConsumed >> 3));
        uVar8 = (int)local_60.ptr - (int)local_60.start;
        if (bVar11) {
          uVar8 = local_60.bitsConsumed >> 3;
        }
        local_60.bitsConsumed = local_60.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_60.bitsConsumed >> 3;
        local_60.bitsConsumed = local_60.bitsConsumed & 7;
        bVar11 = true;
      }
      local_60.ptr = (char *)((long)local_60.ptr - (ulong)uVar8);
      local_60.bitContainer = *(size_t *)local_60.ptr;
      if ((puVar1 + -3 <= dst) || (!bVar11)) break;
      uVar7 = (local_60.bitContainer << ((byte)local_60.bitsConsumed & 0x3f)) >> bVar6;
      iVar9 = *(byte *)((long)DTable + uVar7 * 2 + 4) + local_60.bitsConsumed;
      uVar10 = (local_60.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      iVar9 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar9;
      uVar7 = (local_60.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar9 = (uint)*(byte *)((long)DTable + uVar7 * 2 + 4) + iVar9;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      uVar7 = (local_60.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
      bVar2 = *(byte *)((long)DTable + uVar7 * 2 + 4);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      dst = (void *)((long)dst + 4);
      local_60.bitsConsumed = (uint)bVar2 + iVar9;
    }
  }
LAB_0016b58b:
  for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
    uVar7 = (local_60.bitContainer << ((byte)local_60.bitsConsumed & 0x3f)) >> (-cVar4 & 0x3fU);
    local_60.bitsConsumed = *(byte *)((long)DTable + uVar7 * 2 + 4) + local_60.bitsConsumed;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
  }
  if (local_60.bitsConsumed != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_60.ptr != local_60.start) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}